

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tape.cpp
# Opt level: O2

unique_ptr<BasicTape,_std::default_delete<BasicTape>_> __thiscall
TapeGenerator::generate(TapeGenerator *this,int64_t opt)

{
  runtime_error *this_00;
  int64_t opt_local;
  long local_18;
  
  if ((((uint)opt * 2 | (uint)opt) & 8) == 0) {
    std::make_unique<StandardTape,long&>(&local_18);
    *(long *)this = local_18;
    return (__uniq_ptr_data<BasicTape,_std::default_delete<BasicTape>,_true,_true>)
           (__uniq_ptr_data<BasicTape,_std::default_delete<BasicTape>,_true,_true>)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Runtime Error: Unknown tape type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<BasicTape> TapeGenerator::generate(int64_t opt) {
    using namespace wtlgo::bf;
    uint8_t var = (opt & WRAPPING_TAPE) * 2 + (opt & INFINITE_TAPE);
    switch (var) {
        case true  * 2 + true : return std::make_unique<InfiniteWrappingTape>(opt);
        case true  * 2 + false: return std::make_unique<WrappingTape>(opt);
        case false * 2 + true : return std::make_unique<InfiniteTape>(opt);
        case false * 2 + false: return std::make_unique<StandardTape>(opt);
    
        default: throw std::runtime_error("Runtime Error: Unknown tape type");
    }

    return nullptr; 
}